

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTRealTraffic.cpp
# Opt level: O1

void __thiscall RealTrafficConnection::SetStatus(RealTrafficConnection *this,rtStatusTy s)

{
  int iVar1;
  _Alloc_hider _Var2;
  string local_40;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->rtMutex);
  if (iVar1 == 0) {
    this->status = s;
    if ((int)dataRefs.iLogLevel < 2) {
      if (s == RT_STATUS_NONE) {
        _Var2._M_p = "Stopped";
      }
      else {
        GetStatusStr_abi_cxx11_(&local_40,this);
        _Var2._M_p = local_40._M_dataplus._M_p;
      }
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
             ,0x5af,"SetStatus",logINFO,"RealTraffic network status changed to: %s",_Var2._M_p);
      if ((s != RT_STATUS_NONE) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2)) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->rtMutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void RealTrafficConnection::SetStatus(rtStatusTy s)
{
    // consistent status decision
    std::lock_guard<std::recursive_mutex> lock(rtMutex);

    status = s;
    LOG_MSG(logINFO, MSG_RT_STATUS,
            s == RT_STATUS_NONE ? "Stopped" : GetStatusStr().c_str());
}